

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O0

void __thiscall Snes_Spc::timers_loaded(Snes_Spc *this)

{
  long lVar1;
  Snes_Spc *in_RDI;
  Timer *t;
  int i;
  int local_c;
  
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    lVar1 = (long)local_c;
    (in_RDI->m).timers[lVar1].period = ((in_RDI->m).smp_regs[0][local_c + 10] - 1 & 0xff) + 1;
    (in_RDI->m).timers[lVar1].enabled =
         (int)(uint)(in_RDI->m).smp_regs[0][1] >> ((byte)local_c & 0x1f) & 1;
    (in_RDI->m).timers[lVar1].counter = (in_RDI->m).smp_regs[1][local_c + 0xd] & 0xf;
  }
  set_tempo(in_RDI,(in_RDI->m).tempo);
  return;
}

Assistant:

void Snes_Spc::timers_loaded()
{
	int i;
	for ( i = 0; i < timer_count; i++ )
	{
		Timer* t = &m.timers [i];
		t->period  = IF_0_THEN_256( REGS [r_t0target + i] );
		t->enabled = REGS [r_control] >> i & 1;
		t->counter = REGS_IN [r_t0out + i] & 0x0F;
	}
	
	set_tempo( m.tempo );
}